

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalStartReaders(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  int iVar1;
  bool local_29;
  int local_28;
  int i;
  int nToken;
  int *pRc_local;
  Fts3Expr *pExpr_local;
  Fts3Cursor *pCsr_local;
  
  if ((pExpr != (Fts3Expr *)0x0) && (*pRc == 0)) {
    if (pExpr->eType == 5) {
      iVar1 = pExpr->pPhrase->nToken;
      if (iVar1 != 0) {
        local_28 = 0;
        while ((local_28 < iVar1 &&
               (pExpr->pPhrase->aToken[local_28].pDeferred != (Fts3DeferredToken *)0x0))) {
          local_28 = local_28 + 1;
        }
        pExpr->bDeferred = local_28 == iVar1;
      }
      iVar1 = fts3EvalPhraseStart(pCsr,1,pExpr->pPhrase);
      *pRc = iVar1;
    }
    else {
      fts3EvalStartReaders(pCsr,pExpr->pLeft,pRc);
      fts3EvalStartReaders(pCsr,pExpr->pRight,pRc);
      local_29 = false;
      if (pExpr->pLeft->bDeferred != '\0') {
        local_29 = pExpr->pRight->bDeferred != '\0';
      }
      pExpr->bDeferred = local_29;
    }
  }
  return;
}

Assistant:

static void fts3EvalStartReaders(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expression to initialize phrases in */
  int *pRc                        /* IN/OUT: Error code */
){
  if( pExpr && SQLITE_OK==*pRc ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      int nToken = pExpr->pPhrase->nToken;
      if( nToken ){
        int i;
        for(i=0; i<nToken; i++){
          if( pExpr->pPhrase->aToken[i].pDeferred==0 ) break;
        }
        pExpr->bDeferred = (i==nToken);
      }
      *pRc = fts3EvalPhraseStart(pCsr, 1, pExpr->pPhrase);
    }else{
      fts3EvalStartReaders(pCsr, pExpr->pLeft, pRc);
      fts3EvalStartReaders(pCsr, pExpr->pRight, pRc);
      pExpr->bDeferred = (pExpr->pLeft->bDeferred && pExpr->pRight->bDeferred);
    }
  }
}